

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

TString * luaS_newextlstr(lua_State *L,char *s,size_t len,lua_Alloc falloc,void *ud)

{
  TStatus TVar1;
  undefined1 local_58 [7];
  TStatus status;
  NewExt ne;
  void *ud_local;
  lua_Alloc falloc_local;
  size_t len_local;
  char *s_local;
  lua_State *L_local;
  
  ne.ts = (TString *)ud;
  if (len < 0x29) {
    ne._0_8_ = s;
    ne.s = (char *)len;
    if (falloc == (lua_Alloc)0x0) {
      f_pintern(L,local_58);
    }
    else {
      TVar1 = luaD_rawrunprotected(L,f_pintern,local_58);
      (*falloc)(ne.ts,s,len + 1,0);
      if (TVar1 != '\0') {
        luaD_throw(L,'\x04');
      }
    }
    L_local = (lua_State *)ne.len;
  }
  else {
    if (falloc == (lua_Alloc)0x0) {
      local_58[0] = 0xfe;
      f_newext(L,local_58);
    }
    else {
      local_58[0] = 0xfd;
      TVar1 = luaD_rawrunprotected(L,f_newext,local_58);
      if (TVar1 != '\0') {
        (*falloc)(ne.ts,s,len + 1,0);
        luaD_throw(L,'\x04');
      }
      *(lua_Alloc *)(ne.len + 0x20) = falloc;
      *(TString **)(ne.len + 0x28) = ne.ts;
    }
    *(undefined1 *)(ne.len + 0xb) = local_58[0];
    *(size_t *)(ne.len + 0x10) = len;
    *(char **)(ne.len + 0x18) = s;
    L_local = (lua_State *)ne.len;
  }
  return (TString *)L_local;
}

Assistant:

TString *luaS_newextlstr (lua_State *L,
	          const char *s, size_t len, lua_Alloc falloc, void *ud) {
  struct NewExt ne;
  if (len <= LUAI_MAXSHORTLEN) {  /* short string? */
    ne.s = s; ne.len = len;
    if (!falloc)
      f_pintern(L, &ne);  /* just internalize string */
    else {
      TStatus status = luaD_rawrunprotected(L, f_pintern, &ne);
      (*falloc)(ud, cast_voidp(s), len + 1, 0);  /* free external string */
      if (status != LUA_OK)  /* memory error? */
        luaM_error(L);  /* re-raise memory error */
    }
    return ne.ts;
  }
  /* "normal" case: long strings */
  if (!falloc) {
    ne.kind = LSTRFIX;
    f_newext(L, &ne);  /* just create header */
  }
  else {
    ne.kind = LSTRMEM;
    if (luaD_rawrunprotected(L, f_newext, &ne) != LUA_OK) {  /* mem. error? */
      (*falloc)(ud, cast_voidp(s), len + 1, 0);  /* free external string */
      luaM_error(L);  /* re-raise memory error */
    }
    ne.ts->falloc = falloc;
    ne.ts->ud = ud;
  }
  ne.ts->shrlen = ne.kind;
  ne.ts->u.lnglen = len;
  ne.ts->contents = cast_charp(s);
  return ne.ts;
}